

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O1

char * anon_unknown.dwarf_125bedc::IoParam(TString *s,char *nthArgOrder)

{
  char *__s;
  
  if (*nthArgOrder == '>') {
    __s = "out ";
  }
  else {
    if (*nthArgOrder != '<') {
      return nthArgOrder;
    }
    __s = "in ";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (s,__s);
  return nthArgOrder + 1;
}

Assistant:

const char* IoParam(glslang::TString& s, const char* nthArgOrder)
{
    if (*nthArgOrder == '>') {           // output params
        ++nthArgOrder;
        s.append("out ");
    } else if (*nthArgOrder == '<') {    // input params
        ++nthArgOrder;
        s.append("in ");
    }

    return nthArgOrder;
}